

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

bool __thiscall
c4::yml::Parser::_filter_nl<false,false>
          (Parser *this,substr r,size_t *i,size_t *pos,size_t indentation)

{
  anon_unknown_0 aVar1;
  char *pcVar2;
  code *pcVar3;
  Location LVar4;
  Location LVar5;
  bool bVar6;
  undefined1 uVar7;
  size_t sVar8;
  size_t sVar9;
  size_t *indentation_00;
  csubstr r_00;
  ro_substr chars;
  size_t ii;
  basic_substring<char> local_b8;
  char *local_a8;
  undefined5 uStack_a0;
  undefined3 uStack_9b;
  undefined5 local_98;
  undefined3 uStack_93;
  undefined5 uStack_90;
  undefined3 uStack_8b;
  undefined4 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  char *pcStack_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  char *pcStack_40;
  undefined8 local_38;
  
  local_b8.len = r.len;
  local_b8.str = r.str;
  pcVar2 = (char *)*i;
  if (local_b8.len <= pcVar2) {
    if ((s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar3 = (code *)swi(3);
        uVar7 = (*pcVar3)();
        return (bool)uVar7;
      }
    }
    handle_error(0x21a325,
                 "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                 ,0x14c3,"i >= 0 && i < len");
  }
  aVar1 = ((anon_unknown_0 *)local_b8.str)[(long)pcVar2];
  indentation_00 = pos;
  if (indentation == 0xffffffffffffffff) {
    local_98 = 0x746e65646e;
    uStack_93 = 0x697461;
    uStack_90 = 0x3d21206e6f;
    uStack_8b = 0x706e20;
    local_a8 = (char *)0x6166206b63656863;
    uStack_a0 = 0x3a64656c69;
    uStack_9b = 0x692820;
    local_88 = 0x29736f;
    if ((s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar3 = (code *)swi(3);
        uVar7 = (*pcVar3)();
        return (bool)uVar7;
      }
    }
    local_58 = 0;
    uStack_50 = 0x7bae;
    local_48 = 0;
    pcStack_40 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_38 = 0x65;
    LVar4.super_LineCol.col = 0;
    LVar4.super_LineCol.offset = SUB168(ZEXT816(0x7bae) << 0x40,0);
    LVar4.super_LineCol.line = SUB168(ZEXT816(0x7bae) << 0x40,8);
    LVar4.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar4.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_a8,0x24,LVar4,(this->m_stack).m_callbacks.m_user_data);
  }
  if (aVar1 != (anon_unknown_0)0xa) {
    local_98 = 0x3d20727275;
    uStack_93 = 0x27203d;
    uStack_90 = 0x29276e5c;
    local_a8 = (char *)0x6166206b63656863;
    uStack_a0 = 0x3a64656c69;
    uStack_9b = 0x632820;
    if ((s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar3 = (code *)swi(3);
        uVar7 = (*pcVar3)();
        return (bool)uVar7;
      }
    }
    local_80 = 0;
    uStack_78 = 0x7baf;
    local_70 = 0;
    pcStack_68 = 
    "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    local_60 = 0x65;
    LVar5.super_LineCol.col = 0;
    LVar5.super_LineCol.offset = SUB168(ZEXT816(0x7baf) << 0x40,0);
    LVar5.super_LineCol.line = SUB168(ZEXT816(0x7baf) << 0x40,8);
    LVar5.name.str =
         "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
    ;
    LVar5.name.len = 0x65;
    (*(this->m_stack).m_callbacks.m_error)
              ((char *)&local_a8,0x1d,LVar5,(this->m_stack).m_callbacks.m_user_data);
  }
  r_00.len = (size_t)&local_a8;
  r_00.str = (char *)local_b8.len;
  local_a8 = pcVar2;
  sVar8 = anon_unknown_0::count_following_newlines
                    ((anon_unknown_0 *)local_b8.str,r_00,(size_t *)indentation,
                     (size_t)indentation_00);
  if (sVar8 == 0) {
    chars.len = 2;
    chars.str = " \t";
    sVar8 = basic_substring<char>::first_not_of(&local_b8,chars,(size_t)(pcVar2 + 1));
    if (sVar8 != 0xffffffffffffffff) {
      pcVar2 = (this->m_filter_arena).str;
      sVar8 = *pos;
      *pos = sVar8 + 1;
      pcVar2[sVar8] = ' ';
      bVar6 = true;
      goto LAB_001f9a74;
    }
    *i = local_b8.len;
  }
  else {
    sVar9 = *pos;
    do {
      (this->m_filter_arena).str[sVar9] = '\n';
      sVar9 = sVar9 + 1;
      sVar8 = sVar8 - 1;
    } while (sVar8 != 0);
    *pos = sVar9;
  }
  bVar6 = false;
LAB_001f9a74:
  *i = (size_t)(local_a8 + -1);
  return bVar6;
}

Assistant:

bool Parser::_filter_nl(substr r, size_t *C4_RESTRICT i, size_t *C4_RESTRICT pos, size_t indentation)
{
    // a debugging scaffold:
    #if 0
    #define _c4dbgfnl(fmt, ...) _c4dbgpf("filter_nl[{}]: " fmt, *i, __VA_ARGS__)
    #else
    #define _c4dbgfnl(...)
    #endif

    const char curr = r[*i];
    bool replaced = false;

    _RYML_CB_ASSERT(m_stack.m_callbacks, indentation != npos);
    _RYML_CB_ASSERT(m_stack.m_callbacks, curr == '\n');

    _c4dbgfnl("found newline. sofar=[{}]~~~{}~~~", *pos, m_filter_arena.first(*pos));
    size_t ii = *i;
    size_t numnl_following = count_following_newlines(r, &ii, indentation);
    if(numnl_following)
    {
        _c4dbgfnl("{} consecutive (empty) lines {} in the middle. totalws={}", 1+numnl_following, ii < r.len ? "in the middle" : "at the end", ii - *i);
        for(size_t j = 0; j < numnl_following; ++j)
            m_filter_arena.str[(*pos)++] = '\n';
    }
    else
    {
        if(r.first_not_of(" \t", *i+1) != npos)
        {
            m_filter_arena.str[(*pos)++] = ' ';
            _c4dbgfnl("single newline. convert to space. ii={}/{}. sofar=[{}]~~~{}~~~", ii, r.len, *pos, m_filter_arena.first(*pos));
            replaced = true;
        }
        else
        {
            if C4_IF_CONSTEXPR (keep_trailing_whitespace)
            {
                m_filter_arena.str[(*pos)++] = ' ';
                _c4dbgfnl("single newline. convert to space. ii={}/{}. sofar=[{}]~~~{}~~~", ii, r.len, *pos, m_filter_arena.first(*pos));
                replaced = true;
            }
            else
            {
                _c4dbgfnl("last newline, everything else is whitespace. ii={}/{}", ii, r.len);
                *i = r.len;
            }
        }
        if C4_IF_CONSTEXPR (backslash_is_escape)
        {
            if(ii < r.len && r.str[ii] == '\\')
            {
                const char next = ii+1 < r.len ? r.str[ii+1] : '\0';
                if(next == ' ' || next == '\t')
                {
                    _c4dbgfnl("extend skip to backslash{}", "");
                    ++ii;
                }
            }
        }
    }
    *i = ii - 1; // correct for the loop increment

    #undef _c4dbgfnl

    return replaced;
}